

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::InternalDeallocate<true>
          (RepeatedField<unsigned_int> *this)

{
  bool bVar1;
  int iVar2;
  LogMessage *pLVar3;
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *paVar4;
  HeapRep *p;
  size_t bytes;
  LogMessage local_28;
  Voidify local_11;
  RepeatedField<unsigned_int> *local_10;
  RepeatedField<unsigned_int> *this_local;
  
  local_10 = this;
  bVar1 = is_soo(this);
  if (bVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x264,"!is_soo()");
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_11,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_28);
  }
  iVar2 = Capacity(this,false);
  paVar4 = &heap_rep(this)->field_0;
  if (paVar4->arena == (Arena *)0x0) {
    p = heap_rep(this);
    internal::SizedDelete(p,(long)iVar2 * 4 + 8);
  }
  return;
}

Assistant:

void InternalDeallocate() {
    ABSL_DCHECK(!is_soo());
    const size_t bytes = Capacity(false) * sizeof(Element) + kHeapRepHeaderSize;
    if (heap_rep()->arena == nullptr) {
      internal::SizedDelete(heap_rep(), bytes);
    } else if (!in_destructor) {
      // If we are in the destructor, we might be being destroyed as part of
      // the arena teardown. We can't try and return blocks to the arena then.
      heap_rep()->arena->ReturnArrayMemory(heap_rep(), bytes);
    }
  }